

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

int select_reg(reg_state *state,int vreg,int loc,int src)

{
  uint vreg_00;
  dill_stream_conflict s;
  arg_info_list paVar1;
  private_ctx pdVar2;
  vreg_info *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  int *piVar9;
  preg_info *ptr;
  preg_info *ptr_00;
  long lVar10;
  long lVar11;
  size_t size;
  preg_info *local_68;
  uint local_5c;
  vreg_info *local_58;
  basic_block_conflict local_50;
  bitv tmp_assigns [6];
  
  s = state->c;
  local_50 = state->bb;
  local_58 = s->p->vregs;
  ptr = state->fpregs;
  ptr_00 = state->ipregs;
  iVar4 = dill_type_of(s,vreg);
  local_68 = (&state->fpregs)[1 < iVar4 - 9U];
  if (select_reg::reg_debug == -1) {
    pcVar8 = getenv("REG_DEBUG");
    select_reg::reg_debug = (int)(pcVar8 != (char *)0x0);
  }
  if (vreg < 100) {
    paVar1 = s->p->c_param_args;
    if (paVar1[vreg].is_register != '\0') {
      return paVar1[vreg].in_reg;
    }
  }
  else if (vreg == 100) {
    return s->dill_local_pointer;
  }
  iVar4 = dill_type_of(s,vreg);
  if (iVar4 != 0xc) {
    pdVar2 = state->c->p;
    if (vreg < 100) {
      paVar1 = pdVar2->c_param_args;
      if (paVar1[vreg].is_register == '\0') {
        piVar9 = &state->param_info[vreg].in_reg;
      }
      else {
        piVar9 = &paVar1[vreg].in_reg;
      }
    }
    else {
      piVar9 = &pdVar2->vregs[(ulong)(uint)vreg - 100].in_reg;
    }
    iVar4 = *piVar9;
    if (iVar4 != -1) {
      set_assign_loc(state,vreg,loc);
      if (src != 0) {
        return iVar4;
      }
      set_update_in_reg(state,vreg,1);
      return iVar4;
    }
    tmp_assigns[0].len = 0x16;
    tmp_assigns[0].vec[0] = '\0';
    tmp_assigns[0].vec[1] = '\0';
    tmp_assigns[1].len = 0;
    tmp_assigns[1].vec[0] = '\0';
    tmp_assigns[1].vec[1] = '\0';
    tmp_assigns[2].len = 0;
    tmp_assigns[2].vec[0] = '\0';
    tmp_assigns[2].vec[1] = '\0';
    tmp_assigns[3].len = 0;
    tmp_assigns[3].vec[0] = '\0';
    tmp_assigns[3].vec[1] = '\0';
    tmp_assigns[4].len = 0;
    tmp_assigns[4].vec[0] = '\0';
    tmp_assigns[4].vec[1] = '\0';
    tmp_assigns[5].len = 0;
    tmp_assigns[5].vec[0] = '\0';
    tmp_assigns[5].vec[1] = '\0';
    if (select_reg::reg_debug != 0) {
      printf("Get assignment for vreg %d\n",(ulong)(uint)vreg);
    }
    uVar7 = 0xffffffff;
LAB_00112295:
    while( true ) {
      iVar4 = dill_type_of(s,vreg);
      dill_raw_getreg(s,(dill_reg *)&local_5c,iVar4,0);
      uVar6 = local_5c;
      lVar11 = (long)(int)local_5c;
      if (lVar11 == -1) break;
      tmp_assigns[0].vec[(int)local_5c >> 3] =
           tmp_assigns[0].vec[(int)local_5c >> 3] | (byte)(1 << ((byte)local_5c & 7));
      if (select_reg::reg_debug != 0) {
        printf("checking preg %d\n",(ulong)local_5c);
      }
      if (state->reg_count <= (int)uVar6) {
        size = (lVar11 + 1) * 0x38;
        ptr = (preg_info *)dill_realloc(ptr,size);
        ptr_00 = (preg_info *)dill_realloc(ptr_00,size);
        state->fpregs = ptr;
        state->ipregs = ptr_00;
        for (lVar10 = (long)state->reg_count; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
          ptr[lVar10].holds = -1;
          ptr_00[lVar10].holds = -1;
        }
        iVar4 = dill_type_of(s,vreg);
        local_68 = (&state->fpregs)[1 < iVar4 - 9U];
        state->reg_count = (int)(lVar11 + 1);
      }
      vreg_00 = local_68[lVar11].holds;
      if ((ulong)vreg_00 == 0xffffffff) {
        uVar7 = uVar6;
        if (select_reg::reg_debug != 0) {
          printf("preg %d empty, assigning to vreg %d\n",(ulong)uVar6,(ulong)(uint)vreg);
        }
        break;
      }
      pdVar2 = state->c->p;
      if ((int)vreg_00 < 100) {
        iVar4 = 0;
        if (pdVar2->c_param_args[(int)vreg_00].is_register == '\0') {
          pvVar3 = state->param_info + (int)vreg_00;
          goto LAB_001123cd;
        }
      }
      else {
        pvVar3 = pdVar2->vregs + ((ulong)vreg_00 - 100);
LAB_001123cd:
        iVar4 = pvVar3->assign_loc;
      }
      if ((src == 0) || (iVar4 != loc)) {
        iVar4 = get_last_use(state,vreg_00);
        if ((iVar4 < loc) || (iVar4 == loc && src == 0)) {
          uVar7 = uVar6;
          if (select_reg::reg_debug != 0) {
            printf("preg %d assigned to vreg %d, but that vreg is done, assigning\n",(ulong)uVar6,
                   (ulong)vreg_00);
          }
          break;
        }
        if (uVar7 == 0xffffffff) goto LAB_00112476;
        iVar4 = get_use_metric(state,local_68[(int)uVar7].holds);
        iVar5 = get_use_metric(state,vreg_00);
        if (iVar5 < iVar4) {
          uVar7 = uVar6;
          if (select_reg::reg_debug != 0) {
            pcVar8 = "preg %d is better tentative assign\n";
            goto LAB_0011248f;
          }
        }
        else if (select_reg::reg_debug != 0) {
          printf("previous assign %d was better tentative assign\n",(ulong)uVar7);
        }
      }
      else if (select_reg::reg_debug != 0) {
        printf("preg %d assigned to vreg %d at this loc\n",(ulong)uVar6,(ulong)vreg_00);
      }
    }
    iVar4 = dill_type_of(s,vreg);
    foreach_bit(tmp_assigns,put_unless,s,(void *)((long)iVar4 << 0x18 | 0xffffff));
    if (uVar7 != 0xffffffff) {
      uVar6 = local_68[(int)uVar7].holds;
      if ((long)(int)uVar6 != -1) {
        iVar4 = get_last_use(state,uVar6);
        if (((loc < iVar4) || (iVar4 = live_at_end(local_50,uVar6), iVar4 != 0)) &&
           (iVar4 = update_in_reg(state,uVar6), iVar4 != 0)) {
          iVar4 = offset_of(s,uVar6);
          iVar5 = dill_type_of(s,uVar6);
          set_value_in_mem(state,uVar6,1);
          set_update_in_reg(state,uVar6,0);
          if (iVar4 == -0x21524111) {
            iVar4 = (*s->j->local)(s,0,iVar5);
            local_58[(long)(int)uVar6 + -100].offset = iVar4;
          }
          if (select_reg::reg_debug != 0) {
            printf("Spilling vreg %d to memory, new assignment is %d\n",(ulong)uVar6,
                   (ulong)(uint)vreg);
          }
          (*s->j->storei)(s,iVar5,0,uVar7,(&s->dill_local_pointer)[(int)uVar6 < 100],(long)iVar4);
        }
        set_in_reg(state,uVar6,-1);
      }
    }
    if ((src == 0) || (iVar4 = value_in_mem(state,vreg), iVar4 == 0)) {
      set_update_in_reg(state,vreg,1);
    }
    else {
      uVar6 = offset_of(s,vreg);
      iVar4 = dill_type_of(s,vreg);
      if (uVar6 == 0xdeadbeef) {
        uVar6 = 0;
        printf("Virtual register %d used as source but not previously assigned \n",(ulong)(uint)vreg
              );
      }
      if (select_reg::reg_debug != 0) {
        printf("Loading vreg %d from offset %d into preg %d\n",(ulong)(uint)vreg,(ulong)uVar6,
               (ulong)uVar7);
      }
      if (vreg < 100) {
        iVar5 = s->dill_param_reg_pointer;
      }
      else {
        iVar5 = s->dill_local_pointer;
      }
      (*s->j->loadi)(s,iVar4,0,uVar7,iVar5,(long)(int)uVar6);
    }
    if (uVar7 != 0xffffffff) {
      local_68[(int)uVar7].holds = vreg;
    }
    set_in_reg(state,vreg,uVar7);
    set_assign_loc(state,vreg,loc);
    if (src == 0 || uVar7 != 0xffffffff) {
      return uVar7;
    }
    iVar4 = value_in_mem(state,vreg);
    if (iVar4 == 0) {
      uVar7 = offset_of(s,vreg);
      iVar4 = dill_type_of(s,vreg);
      if (select_reg::reg_debug != 0) {
        printf("Special x86 loading vreg %d from offset %d into preg %d\n",(ulong)(uint)vreg,
               (ulong)uVar7,0xffffffffffffffff);
      }
      if (vreg < 100) {
        iVar5 = s->dill_param_reg_pointer;
      }
      else {
        iVar5 = s->dill_local_pointer;
      }
      (*s->j->loadi)(s,iVar4,0,-1,iVar5,(long)(int)uVar7);
      return -1;
    }
  }
  return -1;
LAB_00112476:
  uVar7 = uVar6;
  if (select_reg::reg_debug != 0) {
    pcVar8 = "preg %d is new tentative assign\n";
LAB_0011248f:
    printf(pcVar8,(ulong)uVar6);
    uVar7 = uVar6;
  }
  goto LAB_00112295;
}

Assistant:

static int
select_reg(reg_state* state, int vreg, int loc, int src)
{
    static int reg_debug = -1;
    int ret_reg = -1;
    int old_vreg = -1;
    vreg_info* vregs = state->c->p->vregs;
    dill_stream c = state->c;
    basic_block bb = state->bb;
    preg_info* pregs;
    preg_info* fpregs = state->fpregs;
    preg_info* ipregs = state->ipregs;
    switch (dill_type_of(c, vreg)) {
    case DILL_F:
    case DILL_D:
        pregs = state->fpregs;
        break;
    default:
        pregs = state->ipregs;
        break;
    }
    if (reg_debug == -1) {
        reg_debug = (getenv("REG_DEBUG") != NULL);
    }
    if (vreg < 100) {
        /* parameter */
        if (c->p->c_param_args[vreg].is_register) {
            return c->p->c_param_args[vreg].in_reg;
        }
    }
    if (vreg == 100) {
        return dill_lp(c);
    }
    if (dill_type_of(c, vreg) == DILL_B) {
        /* not really using this */
        return -1;
    }
    if (get_in_reg(state, vreg) != -1) {
        ret_reg = get_in_reg(state, vreg);
        set_assign_loc(state, vreg, loc);
        if (!src)
            set_update_in_reg(state, vreg, 1);
        return ret_reg;
    } else {
        int preg;
        struct bitv tmp_assigns[6];
        int tentative_assign = -1;
        init_bit_vec(&tmp_assigns[0], sizeof(tmp_assigns));
        if (reg_debug)
            printf("Get assignment for vreg %d\n", vreg);
        while ((preg = get_tentative_assign(c, vreg, &tmp_assigns[0])) != -1) {
            int used_vreg;
            if (reg_debug)
                printf("checking preg %d\n", preg);
            if (preg >= state->reg_count) {
                int i;
                fpregs = realloc(fpregs, sizeof(reg_state) * (preg + 1));
                ipregs = realloc(ipregs, sizeof(reg_state) * (preg + 1));
                state->fpregs = fpregs;
                state->ipregs = ipregs;
                for (i = state->reg_count; i <= preg; i++) {
                    ipregs[i].holds = fpregs[i].holds = -1;
                }
                switch (dill_type_of(c, vreg)) {
                case DILL_F:
                case DILL_D:
                    pregs = state->fpregs;
                    break;
                default:
                    pregs = state->ipregs;
                    break;
                }
                state->reg_count = preg + 1;
            }
            used_vreg = pregs[preg].holds;
            if (used_vreg == -1) {
                ret_reg = preg;
                if (reg_debug)
                    printf("preg %d empty, assigning to vreg %d\n", preg, vreg);
                break;
            }
            if ((get_assign_loc(state, used_vreg) == loc) && src) {
                if (reg_debug)
                    printf("preg %d assigned to vreg %d at this loc\n", preg,
                           used_vreg);
                continue;
            }
            if ((get_last_use(state, used_vreg) < loc) ||
                (!src && (get_last_use(state, used_vreg) == loc))) {
                ret_reg = preg;
                if (reg_debug)
                    printf(
                        "preg %d assigned to vreg %d, but that vreg is done, "
                        "assigning\n",
                        preg, used_vreg);
                break;
            }
            if (tentative_assign == -1) {
                tentative_assign = preg;
                if (reg_debug)
                    printf("preg %d is new tentative assign\n", preg);
            } else if (get_use_metric(state, pregs[tentative_assign].holds) >
                       get_use_metric(state, used_vreg)) {
                if (reg_debug)
                    printf("preg %d is better tentative assign\n", preg);
                tentative_assign = preg;
            } else {
                if (reg_debug)
                    printf("previous assign %d was better tentative assign\n",
                           tentative_assign);
            }
        }
        if (ret_reg == -1)
            ret_reg = tentative_assign;
        put_tentative_assigns(c, -1, &tmp_assigns[0], dill_type_of(c, vreg));
    }
    if (ret_reg != -1)
        old_vreg = pregs[ret_reg].holds;
    if (old_vreg != -1) {
        /* if this is not the same as the old assignment */
        if (((get_last_use(state, old_vreg) > loc) ||
             live_at_end(bb, old_vreg)) &&
            update_in_reg(state, old_vreg)) {
            int offset = offset_of(c, old_vreg);
            int typ = dill_type_of(c, old_vreg);
            set_value_in_mem(state, old_vreg, 1);
            set_update_in_reg(state, old_vreg, 0);
            if (offset == 0xdeadbeef) {
                /* not previously spilled */
                offset = vregs[old_vreg - 100].offset = dill_local(c, typ);
            }
            /* spill vreg to memory */
            if (reg_debug)
                printf("Spilling vreg %d to memory, new assignment is %d\n",
                       old_vreg, vreg);
            if (old_vreg >= 100) {
                c->j->storei(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
            } else {
                c->j->storei(c, typ, 0, ret_reg, c->dill_param_reg_pointer,
                             offset);
            }
        }
        set_in_reg(state, old_vreg, -1);
    }
    if (src && value_in_mem(state, vreg)) {
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (offset == 0xdeadbeef) {
            /* not previously assigned */
            printf(
                "Virtual register %d used as source but not previously "
                "assigned \n",
                vreg);
            offset = 0;
        }
        if (reg_debug)
            printf("Loading vreg %d from offset %d into preg %d\n", vreg,
                   offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    } else {
        set_update_in_reg(state, vreg, 1);
    }
    if (ret_reg != -1)
        pregs[ret_reg].holds = vreg;
    set_in_reg(state, vreg, ret_reg);
    set_assign_loc(state, vreg, loc);
    if (src && (ret_reg == -1) && !value_in_mem(state, vreg)) {
        /* special x86 no float regs case */
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (reg_debug)
            printf("Special x86 loading vreg %d from offset %d into preg %d\n",
                   vreg, offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    }
    return ret_reg;
}